

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_my.h
# Opt level: O2

void __thiscall
PackedArray_my<17U,_2048U>::set_or(PackedArray_my<17U,_2048U> *this,uint offset,uint32_t x)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = x & this->mask;
  uVar1 = offset * 0x11 >> 5;
  uVar3 = offset * 0x11 & 0x1f;
  sVar2 = (sbyte)uVar3;
  if (uVar3 < 0x10) {
    this->buf[uVar1] = this->buf[uVar1] | uVar4 << sVar2;
    return;
  }
  *(ulong *)(this->buf + uVar1) = *(ulong *)(this->buf + uVar1) | (ulong)uVar4 << sVar2;
  return;
}

Assistant:

void set_or(unsigned offset, uint32_t x) {
        x &= mask;

        unsigned cell = offset*bits / 32;
        unsigned start_bit = (offset*bits) % 32;
        if(start_bit <= (32 - bits) ) {
            buf[cell] |= x << start_bit;
        } else {
            uint64_t &p = (uint64_t&)buf[cell];
            p |= uint64_t(x) << start_bit;
        }
    }